

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

char * leveldb_env_get_test_directory(leveldb_env_t *env)

{
  bool bVar1;
  long lVar2;
  void *__src;
  size_t __n;
  char *buffer;
  Status local_40;
  string local_38 [8];
  string result;
  leveldb_env_t *env_local;
  
  std::__cxx11::string::string(local_38);
  (*env->rep->_vptr_Env[0x13])(&local_40,env->rep,local_38);
  bVar1 = leveldb::Status::ok(&local_40);
  leveldb::Status::~Status(&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    lVar2 = std::__cxx11::string::size();
    env_local = (leveldb_env_t *)malloc(lVar2 + 1);
    __src = (void *)std::__cxx11::string::data();
    __n = std::__cxx11::string::size();
    memcpy(env_local,__src,__n);
    lVar2 = std::__cxx11::string::size();
    *(undefined1 *)((long)&env_local->rep + lVar2) = 0;
  }
  else {
    env_local = (leveldb_env_t *)0x0;
  }
  std::__cxx11::string::~string(local_38);
  return (char *)env_local;
}

Assistant:

char* leveldb_env_get_test_directory(leveldb_env_t* env) {
  std::string result;
  if (!env->rep->GetTestDirectory(&result).ok()) {
    return nullptr;
  }

  char* buffer = static_cast<char*>(malloc(result.size() + 1));
  std::memcpy(buffer, result.data(), result.size());
  buffer[result.size()] = '\0';
  return buffer;
}